

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep_context.cc
# Opt level: O2

void __thiscall
p2t::SweepContext::SweepContext
          (SweepContext *this,vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> *polyline)

{
  (this->edge_event).constrained_edge = (Edge *)0x0;
  (this->edge_event).right = false;
  (this->triangles_).super__Vector_base<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->triangles_).super__Vector_base<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->triangles_).super__Vector_base<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->edge_list).super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->edge_list).super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->edge_list).super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->basin).left_node = (Node *)0x0;
  (this->basin).bottom_node = (Node *)0x0;
  (this->basin).right_node = (Node *)0x0;
  *(undefined8 *)((long)&(this->basin).right_node + 1) = 0;
  *(undefined8 *)((long)&(this->basin).width + 1) = 0;
  (this->map_).super__List_base<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->map_;
  (this->map_).super__List_base<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->map_;
  (this->map_).super__List_base<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>._M_impl._M_node.
  _M_size = 0;
  std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>::vector(&this->points_,polyline);
  this->af_middle_ = (Node *)0x0;
  this->af_tail_ = (Node *)0x0;
  this->tail_ = (Point *)0x0;
  this->af_head_ = (Node *)0x0;
  this->front_ = (AdvancingFront *)0x0;
  this->head_ = (Point *)0x0;
  InitEdges(this,&this->points_);
  return;
}

Assistant:

SweepContext::SweepContext(const std::vector<Point*>& polyline) : points_(polyline),
  front_(0),
  head_(0),
  tail_(0),
  af_head_(0),
  af_middle_(0),
  af_tail_(0)
{
  InitEdges(points_);
}